

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  long in_RDI;
  FieldDescriptor *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  Printer *in_stack_00000048;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000050;
  bool in_stack_000000b3;
  FieldAccessorType in_stack_000000b4;
  FieldDescriptor *in_stack_000000b8;
  Printer *in_stack_000000c0;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  PrintExtraFieldInfo(in_stack_00000050,in_stack_00000048);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportFieldPresence((FileDescriptor *)0x59ceea);
  if (bVar1) {
    WriteFieldAccessorDocComment
              (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b3);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b3);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b3);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $has_oneof_case_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    return ($boxed_type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $default$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
}